

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O1

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::AddInitialRange
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,Iterator *first,Iterator *last)

{
  S2CellId other;
  iterator iVar1;
  int level;
  S2LogMessage local_28;
  S2CellId local_18;
  
  local_28._0_8_ =
       (((first->iter_)._M_t.
         super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
         .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).id_;
  other.id_ = (((last->iter_)._M_t.
                super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).id_;
  if (local_28._0_8_ == other.id_) {
    iVar1._M_current =
         (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<S2CellId,_std::allocator<S2CellId>_>::_M_realloc_insert<S2CellId>
                (&this->index_covering_,iVar1,(S2CellId *)&local_28);
    }
    else {
      (iVar1._M_current)->id_ = local_28._0_8_;
      (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_28._0_8_ = S2ShapeIndex::Iterator::cell(first);
  }
  else {
    level = S2CellId::GetCommonAncestorLevel((S2CellId *)&local_28,other);
    if (level < 0) {
      S2LogMessage::S2LogMessage
                (&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                 ,0x343,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_28.stream_,"Check failed: (level) >= (0) ",0x1d);
      abort();
    }
    local_18.id_ = (((first->iter_)._M_t.
                     super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                     .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_)
                   .id_;
    local_28._0_8_ = S2CellId::parent(&local_18,level);
    iVar1._M_current =
         (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<S2CellId,_std::allocator<S2CellId>_>::_M_realloc_insert<S2CellId>
                (&this->index_covering_,iVar1,(S2CellId *)&local_28);
    }
    else {
      (iVar1._M_current)->id_ = local_28._0_8_;
      (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_28._0_8_ = (S2ShapeIndexCell *)0x0;
  }
  absl::InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>>::
  emplace_back<S2ShapeIndexCell_const*>
            ((InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>> *)
             &this->index_cells_,(S2ShapeIndexCell **)&local_28);
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::AddInitialRange(
    const S2ShapeIndex::Iterator& first,
    const S2ShapeIndex::Iterator& last) {
  if (first.id() == last.id()) {
    // The range consists of a single index cell.
    index_covering_.push_back(first.id());
    index_cells_.push_back(&first.cell());
  } else {
    // Add the lowest common ancestor of the given range.
    int level = first.id().GetCommonAncestorLevel(last.id());
    S2_DCHECK_GE(level, 0);
    index_covering_.push_back(first.id().parent(level));
    index_cells_.push_back(nullptr);
  }
}